

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_host_unmap(nvrm_ioctl_host_unmap *s)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  nvrm_ioctl_host_unmap *s_local;
  
  if ((s->cid != 0) || (iVar2 = _nvrm_field_enabled("cid"), iVar2 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
    if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  if ((s->subdev != 0) || (iVar2 = _nvrm_field_enabled("subdev"), iVar2 != 0)) {
    if ((s->subdev != 0) || (iVar2 = _nvrm_field_enabled("subdev"), iVar2 != 0)) {
      fprintf(_stdout,"%ssubdev: 0x%08x",nvrm_pfx,(ulong)s->subdev);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->subdev,"subdev");
  }
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->foffset != 0) || (iVar2 = _nvrm_field_enabled("foffset"), iVar2 != 0)) {
    fprintf(_stdout,"%sfoffset: 0x%016lx",nvrm_pfx,s->foffset);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->status != 0) || (iVar2 = _nvrm_field_enabled("status"), iVar2 != 0)) {
    __stream = _stdout;
    pcVar1 = nvrm_pfx;
    pcVar3 = nvrm_status(s->status);
    fprintf(__stream,"%sstatus: %s",pcVar1,pcVar3);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_host_unmap(struct nvrm_ioctl_host_unmap *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, subdev, cid);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_x64(s, foffset);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}